

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_pcode.cpp
# Opt level: O3

bool __thiscall
PcodeGenerator::CanInline(PcodeGenerator *this,string *top_label,string *bottom_label)

{
  PcodeType PVar1;
  pointer pcVar2;
  size_t __n;
  int iVar3;
  pointer pPVar4;
  pointer pPVar5;
  iterator iter;
  pointer pPVar6;
  bool bVar7;
  string num1;
  pointer local_60;
  undefined1 *local_58;
  size_t local_50;
  undefined1 local_48 [16];
  string *local_38;
  
  local_38 = bottom_label;
  iVar3 = std::__cxx11::string::compare((char *)top_label);
  if (iVar3 == 0) {
LAB_0013426f:
    bVar7 = false;
  }
  else {
    pPVar5 = (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar7 = true;
    if (pPVar5 != (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pPVar6 = (pointer)0x0;
      local_60 = (pointer)0x0;
      do {
        PVar1 = pPVar5->m_op;
        local_58 = local_48;
        pcVar2 = (pPVar5->m_num1)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,pcVar2,pcVar2 + (pPVar5->m_num1)._M_string_length);
        __n = local_50;
        if (local_50 == top_label->_M_string_length) {
          if (local_50 == 0) {
            bVar7 = true;
          }
          else {
            iVar3 = bcmp(local_58,(top_label->_M_dataplus)._M_p,local_50);
            bVar7 = iVar3 == 0;
          }
          pPVar4 = pPVar6;
          if (bVar7) {
            pPVar4 = pPVar5;
          }
          if (PVar1 == LABEL) {
            pPVar6 = pPVar4;
          }
        }
        if (__n == local_38->_M_string_length) {
          if (__n == 0) {
            bVar7 = true;
          }
          else {
            iVar3 = bcmp(local_58,(local_38->_M_dataplus)._M_p,__n);
            bVar7 = iVar3 == 0;
          }
          pPVar4 = local_60;
          if (bVar7) {
            pPVar4 = pPVar5;
          }
          if (PVar1 == LABEL) {
            local_60 = pPVar4;
          }
        }
        if (local_58 != local_48) {
          operator_delete(local_58);
        }
        pPVar5 = pPVar5 + 1;
      } while (pPVar5 != (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
      if (pPVar6 != local_60) {
        do {
          PVar1 = pPVar6->m_op;
          local_58 = local_48;
          pcVar2 = (pPVar6->m_num1)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,pcVar2,pcVar2 + (pPVar6->m_num1)._M_string_length);
          if ((ulong)PVar1 == 0xe) {
            iVar3 = std::__cxx11::string::compare((char *)&local_58);
            if (iVar3 == 0) goto LAB_0013422e;
LAB_0013425b:
            if (local_58 != local_48) {
              operator_delete(local_58);
            }
            goto LAB_0013426f;
          }
          if (PVar1 == CALL) goto LAB_0013425b;
LAB_0013422e:
          if (*pcode_string[PVar1] == 'B') goto LAB_0013425b;
          if (local_58 != local_48) {
            operator_delete(local_58);
          }
          pPVar6 = pPVar6 + 1;
        } while (pPVar6 != local_60);
      }
      bVar7 = true;
    }
  }
  return bVar7;
}

Assistant:

bool PcodeGenerator::CanInline(const string& top_label, const string& bottom_label) {
    if (top_label == "main")
        return false;
    vector<Pcode>::iterator iter_top;
    vector<Pcode>::iterator iter_bottom;
    auto iter = m_pcode_queue.begin();
    for (; iter != m_pcode_queue.end(); ++iter) {
        PcodeType op = iter->GetOP();
        string num1 = iter->GetNum1();
        if (num1 == top_label && op == LABEL)
            iter_top = iter;
        if (num1 == bottom_label && op == LABEL)
            iter_bottom = iter;
    }
    for (auto iter = iter_top; iter != iter_bottom; ++iter) {
        PcodeType op = iter->GetOP();
        string num1 = iter->GetNum1();
        if ((op == JUMP && num1 != "RA") || op == CALL || pcode_string[op][0] == 'B')
        //if ((op == JUMP && num1 != "RA") || op == CALL)
            return false;
    }
    return true;
}